

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteFixed64
               (int field_number,uint64_t value,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  uint64_t value_local;
  int field_number_local;
  
  WriteTag(field_number,WIRETYPE_FIXED64,output);
  WriteFixed64NoTag(value,output);
  return;
}

Assistant:

void WireFormatLite::WriteFixed64(int field_number, uint64_t value,
                                  io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED64, output);
  WriteFixed64NoTag(value, output);
}